

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

void __thiscall
TTD::ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  FunctionBody *pFVar1;
  uint startOffset;
  ULONG local_20;
  LONG local_1c;
  ULONG srcLine;
  LONG srcColumn;
  
  pFVar1 = (this->m_lastReturnLocation).m_lastFrame.Function;
  if (pFVar1 == (FunctionBody *)0x0) {
    sourceLocation->m_sourceScriptLogId = 0;
    *(undefined4 *)&sourceLocation->m_bpId = 0xffffffff;
    *(undefined4 *)((long)&sourceLocation->m_bpId + 4) = 0xffffffff;
    *(undefined4 *)&sourceLocation->m_etime = 0xffffffff;
    *(undefined4 *)((long)&sourceLocation->m_etime + 4) = 0xffffffff;
    sourceLocation->m_ftime = 0;
    sourceLocation->m_ltime = 0;
    sourceLocation->m_topLevelBodyId = 0;
    sourceLocation->m_functionLine = 0;
    sourceLocation->m_functionColumn = 0;
    sourceLocation->m_line = 0;
    sourceLocation->m_column = 0;
    return;
  }
  local_20 = 0;
  local_1c = -1;
  startOffset = Js::FunctionBody::GetStatementStartOffset
                          (pFVar1,(this->m_lastReturnLocation).m_lastFrame.CurrentStatementIndex);
  pFVar1 = (this->m_lastReturnLocation).m_lastFrame.Function;
  if (pFVar1 != (FunctionBody *)0x0) {
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD(pFVar1,startOffset,&local_20,&local_1c);
    pFVar1 = (this->m_lastReturnLocation).m_lastFrame.Function;
    if (pFVar1 != (FunctionBody *)0x0) {
      TTDebuggerSourceLocation::SetLocationFull
                (sourceLocation,this->m_topLevelCallbackEventTime,
                 (this->m_lastReturnLocation).m_lastFrame.FunctionTime,
                 (this->m_lastReturnLocation).m_lastFrame.CurrentStatementLoopTime,pFVar1,local_20,
                 local_1c);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Should check this!");
}

Assistant:

void ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        const TTLastReturnLocationInfo& cframe = this->m_lastReturnLocation;

        if(!cframe.IsDefined())
        {
            sourceLocation.Clear();
            return;
        }
        else
        {
            ULONG srcLine = 0;
            LONG srcColumn = -1;
            uint32 startOffset = cframe.GetLocation().Function->GetStatementStartOffset(cframe.GetLocation().CurrentStatementIndex);
            cframe.GetLocation().Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

            sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, cframe.GetLocation().FunctionTime, cframe.GetLocation().CurrentStatementLoopTime, cframe.GetLocation().Function, srcLine, srcColumn);
        }
    }